

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,bin_writer<3> f)

{
  uint uVar1;
  ulong uVar2;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  local_38;
  
  local_38.prefix.size_ = prefix.size_;
  local_38.prefix.data_ = prefix.data_;
  if (num_digits < 0) {
LAB_001426eb:
    assert_fail(specs._8_8_,0,specs._0_8_);
  }
  local_38.fill = specs.fill.data_[0];
  local_38.size_ = (uint)num_digits + local_38.prefix.size_;
  if ((specs._9_1_ & 0xf) == 4) {
    if (specs.width < 0) goto LAB_001426eb;
    uVar2 = (ulong)(specs.width & 0x7fffffff);
    local_38.padding = 0;
    if (local_38.size_ <= uVar2) {
      local_38.padding = uVar2 - local_38.size_;
      local_38.size_ = uVar2;
    }
  }
  else {
    uVar1 = specs.precision - num_digits;
    if (uVar1 == 0 || specs.precision < num_digits) {
      local_38.padding = 0;
    }
    else {
      if ((int)uVar1 < 0) goto LAB_001426eb;
      local_38.size_ = ((ulong)specs._0_8_ >> 0x20) + local_38.prefix.size_;
      local_38.padding = (size_t)uVar1;
      local_38.fill = '0';
    }
  }
  local_38.f = f;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::bin_writer<3>>>
            (this,(format_specs *)&stack0xffffffffffffffb8,&local_38);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }